

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-reference.c
# Opt level: O0

void KeccakP1600_DisplayRhoOffsets(FILE *f)

{
  FILE *in_RDI;
  uint y;
  uint x;
  uint local_10;
  uint local_c;
  
  for (local_10 = 0; local_10 < 5; local_10 = local_10 + 1) {
    for (local_c = 0; local_c < 5; local_c = local_c + 1) {
      fprintf(in_RDI,"RhoOffset[%i][%i] = ",(ulong)local_c,(ulong)local_10);
      fprintf(in_RDI,"%2i",(ulong)KeccakRhoOffsets[local_c % 5 + (local_10 % 5) * 5]);
      fprintf(in_RDI,"\n");
    }
  }
  fprintf(in_RDI,"\n");
  return;
}

Assistant:

void KeccakP1600_DisplayRhoOffsets(FILE *f)
{
    unsigned int x, y;

    for(y=0; y<5; y++) for(x=0; x<5; x++) {
        fprintf(f, "RhoOffset[%i][%i] = ", x, y);
        fprintf(f, "%2i", KeccakRhoOffsets[index(x, y)]);
        fprintf(f, "\n");
    }
    fprintf(f, "\n");
}